

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrokeTests.cpp
# Opt level: O2

void __thiscall
agge::tests::PathStrokeTests::TwoOutlinesAreGeneratedForPolygons(PathStrokeTests *this)

{
  undefined4 uVar1;
  int iVar2;
  real_t rVar3;
  double dVar4;
  point pVar5;
  stroke s;
  allocator local_7a9;
  undefined1 local_7a8 [16];
  undefined1 auStack_798 [20];
  point local_784;
  point local_778;
  point local_76c;
  point local_760;
  point local_754;
  point local_748;
  point local_73c;
  point local_730;
  point local_724;
  point local_718;
  point local_70c;
  point local_700;
  point local_6f4;
  point local_6e8;
  point local_6dc;
  point local_6d0;
  point local_6c4;
  point local_6b8;
  point local_6ac;
  point local_6a0;
  point local_694;
  point local_688;
  point local_67c;
  point local_670;
  point local_664;
  point local_658;
  point local_64c;
  point local_640;
  point local_634;
  point local_628;
  point local_61c;
  point local_610;
  point local_604;
  point local_5f8;
  point local_5ec;
  point local_5e0;
  point local_5d4;
  point local_5c8;
  point local_5bc;
  point local_5b0;
  undefined1 local_598 [32];
  int local_578;
  point local_574;
  ulong local_568;
  int local_560;
  point local_55c;
  point local_550;
  point local_544;
  point local_538;
  ulong local_52c;
  int local_524;
  point local_520;
  point local_514;
  point local_508;
  point local_4fc;
  ulong local_4f0;
  int local_4e8;
  point local_4e4;
  point local_4d8;
  point local_4cc;
  point local_4c0;
  ulong local_4b4;
  int local_4ac;
  point local_4a8;
  point local_49c;
  point local_490;
  point local_484;
  point local_478;
  ulong local_46c;
  int local_464;
  point local_460;
  point local_454;
  point local_448;
  point local_43c;
  ulong local_430;
  int local_428;
  point local_424;
  point local_418;
  point local_40c;
  point local_400;
  ulong local_3f4;
  int local_3ec;
  point local_3e8;
  point local_3dc;
  point local_3d0;
  point local_3c4;
  ulong local_3b8;
  int local_3b0;
  point local_3ac;
  point local_3a0 [2];
  point local_388;
  undefined8 local_37c;
  undefined4 local_374;
  undefined8 local_370;
  undefined4 local_368;
  undefined8 local_364;
  undefined4 local_35c;
  undefined8 local_358;
  undefined4 local_350;
  undefined8 local_34c;
  undefined4 local_344;
  undefined8 local_340;
  undefined4 local_338;
  undefined8 local_334;
  undefined4 local_32c;
  undefined8 local_328;
  undefined4 local_320;
  undefined8 local_31c;
  undefined4 local_314;
  undefined8 local_310;
  undefined4 local_308;
  undefined8 local_304;
  undefined4 local_2fc;
  undefined8 local_2f8;
  undefined4 local_2f0;
  undefined8 local_2ec;
  undefined4 local_2e4;
  ulong local_2e0;
  undefined4 local_2d8;
  undefined8 local_2d4;
  undefined4 local_2cc;
  undefined8 local_2c8;
  undefined4 local_2c0;
  undefined8 local_2bc;
  undefined4 local_2b4;
  undefined8 local_2b0;
  undefined4 local_2a8;
  undefined8 local_2a4;
  undefined4 local_29c;
  ulong local_298;
  undefined4 local_290;
  undefined8 local_28c;
  undefined4 local_284;
  undefined8 local_280;
  undefined4 local_278;
  undefined8 local_274;
  undefined4 local_26c;
  undefined8 local_268;
  undefined4 local_260;
  undefined8 local_25c;
  undefined4 local_254;
  undefined8 local_250;
  undefined4 local_248;
  undefined8 local_244;
  undefined4 local_23c;
  undefined8 local_238;
  undefined4 local_230;
  undefined8 local_22c;
  undefined4 local_224;
  undefined8 local_220;
  undefined4 local_218;
  undefined8 local_214;
  undefined4 local_20c;
  undefined8 local_208;
  undefined4 local_200;
  point local_1f8;
  point local_1ec;
  point local_1e0;
  point local_1d4;
  point local_1c8;
  point local_1bc;
  point local_1b0;
  point local_1a4;
  point local_198;
  point local_18c;
  point local_180;
  point local_174;
  point local_168;
  point local_15c;
  point local_150;
  point local_144;
  point local_138;
  point local_12c;
  point local_120;
  point local_114;
  point local_108;
  point local_fc;
  point local_f0;
  point local_e4;
  point local_d8;
  point local_cc;
  point local_c0;
  point local_b4;
  point local_a8;
  point local_9c;
  point local_90;
  point local_84;
  point local_78;
  string local_60;
  LocationInfo local_40;
  
  stroke::stroke(&s);
  move_to<agge::stroke>(&s,1.0,1.0);
  stroke::add_vertex(&s,4.0,5.0,2);
  uVar1 = 2;
  stroke::add_vertex(&s,4.0,15.0,2);
  end_poly<agge::stroke>(&s,true);
  this->amount_alive = this->amount_alive + 1;
  local_7a8._0_8_ = &PTR__counted_001d5138;
  local_7a8._8_8_ = this;
  stroke::set_join<agge::tests::(anonymous_namespace)::passthrough_join>
            (&s,(passthrough_join *)local_7a8);
  this->amount_alive = this->amount_alive - 1;
  stroke::width(&s,2.0);
  local_1f8 = vertex<agge::stroke>(&s);
  local_1ec = vertex<agge::stroke>(&s);
  local_1e0 = vertex<agge::stroke>(&s);
  local_1d4 = vertex<agge::stroke>(&s);
  local_1c8 = vertex<agge::stroke>(&s);
  local_1bc = vertex<agge::stroke>(&s);
  local_1b0 = vertex<agge::stroke>(&s);
  local_1a4 = vertex<agge::stroke>(&s);
  local_198 = vertex<agge::stroke>(&s);
  local_18c = vertex<agge::stroke>(&s);
  local_180 = vertex<agge::stroke>(&s);
  local_174 = vertex<agge::stroke>(&s);
  local_168 = vertex<agge::stroke>(&s);
  local_15c = vertex<agge::stroke>(&s);
  local_150 = vertex<agge::stroke>(&s);
  local_144 = vertex<agge::stroke>(&s);
  local_138 = vertex<agge::stroke>(&s);
  local_12c = vertex<agge::stroke>(&s);
  local_120 = vertex<agge::stroke>(&s);
  local_114 = vertex<agge::stroke>(&s);
  local_108 = vertex<agge::stroke>(&s);
  local_fc = vertex<agge::stroke>(&s);
  local_f0 = vertex<agge::stroke>(&s);
  local_e4 = vertex<agge::stroke>(&s);
  local_d8 = vertex<agge::stroke>(&s);
  local_cc = vertex<agge::stroke>(&s);
  local_c0 = vertex<agge::stroke>(&s);
  local_b4 = vertex<agge::stroke>(&s);
  local_a8 = vertex<agge::stroke>(&s);
  local_9c = vertex<agge::stroke>(&s);
  local_90 = vertex<agge::stroke>(&s);
  local_84 = vertex<agge::stroke>(&s);
  local_78 = vertex<agge::stroke>(&s);
  dVar4 = sqrt(5.57859275551463e-315);
  local_388.y = SUB84(dVar4,0);
  local_388.x = 1.0;
  local_388.command = 1;
  local_37c = 0x4170000040800000;
  local_370 = 0x3f8000003f800000;
  local_364 = 0x40a0000040800000;
  local_358 = 0x40a00000;
  local_34c = 0x40a000003f800000;
  local_340 = 0x3f8000003f800000;
  local_334 = 0x40a0000040800000;
  local_328 = 0x4170000040800000;
  local_31c = 0x41200000;
  local_310 = 0x412000003f800000;
  local_304 = 0x40a0000040800000;
  local_2f8 = 0x4170000040800000;
  local_2ec = 0x3f8000003f800000;
  local_374 = uVar1;
  local_368 = uVar1;
  local_35c = uVar1;
  local_350 = uVar1;
  local_344 = uVar1;
  local_338 = uVar1;
  local_32c = uVar1;
  local_320 = uVar1;
  local_314 = uVar1;
  local_308 = uVar1;
  local_2fc = uVar1;
  local_2f0 = uVar1;
  local_2e4 = uVar1;
  dVar4 = sqrt(5.57859275551463e-315);
  local_2e0 = (ulong)dVar4 & 0xffffffff;
  local_2d4 = 0;
  local_2cc = 0x30;
  local_2c8 = 0x40a000003f800000;
  local_2c0 = 1;
  local_2bc = 0x40a0000040800000;
  local_2b0 = 0x3f8000003f800000;
  local_2a4 = 0x4170000040800000;
  local_2d8 = uVar1;
  local_2b4 = uVar1;
  local_2a8 = uVar1;
  local_29c = uVar1;
  dVar4 = sqrt(5.57859275551463e-315);
  local_298 = (ulong)dVar4 & 0xffffffff;
  local_290 = 2;
  dVar4 = sqrt(5.57859275551463e-315);
  local_28c = CONCAT44(SUB84(dVar4,0),0x3f800000);
  local_280 = 0x3f8000003f800000;
  local_274 = 0x4170000040800000;
  local_268 = 0x40a0000040800000;
  local_25c = 0x41200000;
  local_250 = 0x412000003f800000;
  local_244 = 0x4170000040800000;
  local_238 = 0x40a0000040800000;
  local_22c = 0x3f8000003f800000;
  local_220 = 0x40a00000;
  local_214 = 0;
  local_20c = 0x30;
  local_208 = 0;
  local_200 = 0;
  local_284 = uVar1;
  local_278 = uVar1;
  local_26c = uVar1;
  local_260 = uVar1;
  local_254 = uVar1;
  local_248 = uVar1;
  local_23c = uVar1;
  local_230 = uVar1;
  local_224 = uVar1;
  local_218 = uVar1;
  std::__cxx11::string::string
            ((string *)local_598,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/StrokeTests.cpp"
             ,(allocator *)&local_40);
  ut::LocationInfo::LocationInfo((LocationInfo *)local_7a8,(string *)local_598,0x175);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,33ul>
            ((point (*) [33])&local_388,(point (*) [33])&local_1f8,(LocationInfo *)local_7a8);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  stroke::remove_all(&s);
  move_to<agge::stroke>(&s,1.0,1.0);
  stroke::add_vertex(&s,5.0,2.0,2);
  stroke::add_vertex(&s,4.0,6.0,2);
  iVar2 = 2;
  stroke::add_vertex(&s,0.0,5.0,2);
  end_poly<agge::stroke>(&s,true);
  pVar5 = vertex<agge::stroke>(&s);
  local_7a8._0_8_ = pVar5._0_8_;
  local_7a8._8_4_ = pVar5.command;
  pVar5 = vertex<agge::stroke>(&s);
  local_7a8._12_4_ = pVar5.x;
  auStack_798._0_8_ = pVar5._4_8_;
  auStack_798._8_12_ = (undefined1  [12])vertex<agge::stroke>(&s);
  local_784 = vertex<agge::stroke>(&s);
  local_778 = vertex<agge::stroke>(&s);
  local_76c = vertex<agge::stroke>(&s);
  local_760 = vertex<agge::stroke>(&s);
  local_754 = vertex<agge::stroke>(&s);
  local_748 = vertex<agge::stroke>(&s);
  local_73c = vertex<agge::stroke>(&s);
  local_730 = vertex<agge::stroke>(&s);
  local_724 = vertex<agge::stroke>(&s);
  local_718 = vertex<agge::stroke>(&s);
  local_70c = vertex<agge::stroke>(&s);
  local_700 = vertex<agge::stroke>(&s);
  local_6f4 = vertex<agge::stroke>(&s);
  local_6e8 = vertex<agge::stroke>(&s);
  local_6dc = vertex<agge::stroke>(&s);
  local_6d0 = vertex<agge::stroke>(&s);
  local_6c4 = vertex<agge::stroke>(&s);
  local_6b8 = vertex<agge::stroke>(&s);
  local_6ac = vertex<agge::stroke>(&s);
  local_6a0 = vertex<agge::stroke>(&s);
  local_694 = vertex<agge::stroke>(&s);
  local_688 = vertex<agge::stroke>(&s);
  local_67c = vertex<agge::stroke>(&s);
  local_670 = vertex<agge::stroke>(&s);
  local_664 = vertex<agge::stroke>(&s);
  local_658 = vertex<agge::stroke>(&s);
  local_64c = vertex<agge::stroke>(&s);
  local_640 = vertex<agge::stroke>(&s);
  local_634 = vertex<agge::stroke>(&s);
  local_628 = vertex<agge::stroke>(&s);
  local_61c = vertex<agge::stroke>(&s);
  local_610 = vertex<agge::stroke>(&s);
  local_604 = vertex<agge::stroke>(&s);
  local_5f8 = vertex<agge::stroke>(&s);
  local_5ec = vertex<agge::stroke>(&s);
  local_5e0 = vertex<agge::stroke>(&s);
  local_5d4 = vertex<agge::stroke>(&s);
  local_5c8 = vertex<agge::stroke>(&s);
  local_5bc = vertex<agge::stroke>(&s);
  local_5b0 = vertex<agge::stroke>(&s);
  dVar4 = sqrt(5.43191549518332e-315);
  rVar3 = SUB84(dVar4,0);
  local_598._0_8_ = CONCAT44(rVar3,0x3f800000);
  local_598._12_4_ = 0.0;
  local_598._16_4_ = 5.0;
  local_598._24_8_ = 0x3f8000003f800000;
  local_574.x = 5.0;
  local_574.y = 2.0;
  local_568 = (ulong)dVar4 & 0xffffffff;
  local_55c.y = rVar3;
  local_55c.x = 1.0;
  local_550.x = 1.0;
  local_550.y = 1.0;
  local_544.x = 5.0;
  local_544.y = 2.0;
  local_538.x = 4.0;
  local_538.y = 6.0;
  local_520.y = rVar3;
  local_520.x = 1.0;
  local_514.x = 5.0;
  local_514.y = 2.0;
  local_508.x = 4.0;
  local_508.y = 6.0;
  local_4fc.x = 0.0;
  local_4fc.y = 5.0;
  local_4e4.y = rVar3;
  local_4e4.x = 1.0;
  local_4d8.x = 4.0;
  local_4d8.y = 6.0;
  local_4cc.x = 0.0;
  local_4cc.y = 5.0;
  local_4c0.x = 1.0;
  local_4c0.y = 1.0;
  local_4a8.x = 0.0;
  local_4a8.y = 0.0;
  local_4a8.command = 0x30;
  local_49c.y = rVar3;
  local_49c.x = 1.0;
  local_490.x = 5.0;
  local_490.y = 2.0;
  local_484.x = 1.0;
  local_484.y = 1.0;
  local_478.x = 0.0;
  local_478.y = 5.0;
  local_460.y = rVar3;
  local_460.x = 1.0;
  local_454.x = 1.0;
  local_454.y = 1.0;
  local_448.x = 0.0;
  local_448.y = 5.0;
  local_43c.x = 4.0;
  local_43c.y = 6.0;
  local_424.y = rVar3;
  local_424.x = 1.0;
  local_418.x = 0.0;
  local_418.y = 5.0;
  local_40c.x = 4.0;
  local_40c.y = 6.0;
  local_400.x = 5.0;
  local_400.y = 2.0;
  local_3e8.y = rVar3;
  local_3e8.x = 1.0;
  local_3dc.x = 4.0;
  local_3dc.y = 6.0;
  local_3d0.x = 5.0;
  local_3d0.y = 2.0;
  local_3c4.x = 1.0;
  local_3c4.y = 1.0;
  local_3ac.x = 0.0;
  local_3ac.y = 0.0;
  local_3a0[0].x = 0.0;
  local_3a0[0].y = 0.0;
  local_3a0[0].command = 0;
  local_598._8_4_ = 1;
  local_598._20_4_ = iVar2;
  local_578 = iVar2;
  local_574.command = iVar2;
  local_560 = iVar2;
  local_55c.command = iVar2;
  local_550.command = iVar2;
  local_544.command = iVar2;
  local_538.command = iVar2;
  local_52c = local_568;
  local_524 = iVar2;
  local_520.command = iVar2;
  local_514.command = iVar2;
  local_508.command = iVar2;
  local_4fc.command = iVar2;
  local_4f0 = local_568;
  local_4e8 = iVar2;
  local_4e4.command = iVar2;
  local_4d8.command = iVar2;
  local_4cc.command = iVar2;
  local_4c0.command = iVar2;
  local_4b4 = local_568;
  local_4ac = iVar2;
  local_49c.command = 1;
  local_490.command = iVar2;
  local_484.command = iVar2;
  local_478.command = iVar2;
  local_46c = local_568;
  local_464 = iVar2;
  local_460.command = iVar2;
  local_454.command = iVar2;
  local_448.command = iVar2;
  local_43c.command = iVar2;
  local_430 = local_568;
  local_428 = iVar2;
  local_424.command = iVar2;
  local_418.command = iVar2;
  local_40c.command = iVar2;
  local_400.command = iVar2;
  local_3f4 = local_568;
  local_3ec = iVar2;
  local_3e8.command = iVar2;
  local_3dc.command = iVar2;
  local_3d0.command = iVar2;
  local_3c4.command = iVar2;
  local_3b8 = local_568;
  local_3b0 = iVar2;
  local_3ac.command = local_4a8.command;
  std::__cxx11::string::string
            ((string *)&local_60,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/StrokeTests.cpp"
             ,&local_7a9);
  ut::LocationInfo::LocationInfo(&local_40,&local_60,0x19e);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,43ul>
            ((point (*) [43])local_598,(point (*) [43])local_7a8,&local_40);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  stroke::~stroke(&s);
  return;
}

Assistant:

test( TwoOutlinesAreGeneratedForPolygons )
			{
				// INIT
				stroke s;

				move_to(s, 1.0f, 1.0f);
				line_to(s, 4.0f, 5.0f);
				line_to(s, 4.0f, 15.0f);
				end_poly(s, true);

				s.set_join(passthrough_join(amount_alive));
				s.width(2.0f);

				// ACT
				mocks::path::point points1[] = {
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s),
				};

				// ASSERT
				mocks::path::point reference1[] = {
					moveto(1.0f, sqrt(205.0f)), lineto(4.0f, 15.0f), lineto(1.0f, 1.0f), lineto(4.0f, 5.0f), lineto(5.0f, 0.0f),
					lineto(1.0f, 5.0f), lineto(1.0f, 1.0f), lineto(4.0f, 5.0f), lineto(4.0f, 15.0f), lineto(10.0f, 0.0f),
					lineto(1.0f, 10.0f), lineto(4.0f, 5.0f), lineto(4.0f, 15.0f), lineto(1.0f, 1.0f), lineto(sqrt(205.0f), 0.0f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close },
					moveto(1.0f, 5.0f), lineto(4.0f, 5.0f), lineto(1.0f, 1.0f), lineto(4.0f, 15.0f), lineto(sqrt(205.0f), 0.0f),
					lineto(1.0f, sqrt(205.0f)), lineto(1.0f, 1.0f), lineto(4.0f, 15.0f), lineto(4.0f, 5.0f), lineto(10.0f, 0.0f),
					lineto(1.0f, 10.0f), lineto(4.0f, 15.0f), lineto(4.0f, 5.0f), lineto(1.0f, 1.0f), lineto(5.0f, 0.0f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference1, points1);

				// INIT
				s.remove_all();

				move_to(s, 1.0f, 1.0f);
				line_to(s, 5.0f, 2.0f);
				line_to(s, 4.0f, 6.0f);
				line_to(s, 0.0f, 5.0f);
				end_poly(s, true);

				// ACT
				mocks::path::point points2[] = {
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s), vertex(s), vertex(s), vertex(s),
					vertex(s), vertex(s),
				};

				// ASSERT
				real_t l = sqrt(17.0f);
				mocks::path::point reference2[] = {
					moveto(1.0f, l), lineto(0.0f, 5.0f), lineto(1.0f, 1.0f), lineto(5.0f, 2.0f), lineto(l, 0.0f),
					lineto(1.0f, l), lineto(1.0f, 1.0f), lineto(5.0f, 2.0f), lineto(4.0f, 6.0f), lineto(l, 0.0f),
					lineto(1.0f, l), lineto(5.0f, 2.0f), lineto(4.0f, 6.0f), lineto(0.0f, 5.0f), lineto(l, 0.0f),
					lineto(1.0f, l), lineto(4.0f, 6.0f), lineto(0.0f, 5.0f), lineto(1.0f, 1.0f), lineto(l, 0.0f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close },
					moveto(1.0f, l), lineto(5.0f, 2.0f), lineto(1.0f, 1.0f), lineto(0.0f, 5.0f), lineto(l, 0.0f),
					lineto(1.0f, l), lineto(1.0f, 1.0f), lineto(0.0f, 5.0f), lineto(4.0f, 6.0f), lineto(l, 0.0f),
					lineto(1.0f, l), lineto(0.0f, 5.0f), lineto(4.0f, 6.0f), lineto(5.0f, 2.0f), lineto(l, 0.0f),
					lineto(1.0f, l), lineto(4.0f, 6.0f), lineto(5.0f, 2.0f), lineto(1.0f, 1.0f), lineto(l, 0.0f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference2, points2);
			}